

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int hasInternalSubsetSplit(void *ctx)

{
  xmlSchemaSAXPlugPtr ctxt;
  void *ctx_local;
  
  if (((ctx == (void *)0x0) || (*(long *)((long)ctx + 0x10) == 0)) ||
     (*(long *)(*(long *)((long)ctx + 0x10) + 0x10) == 0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ =
         (**(code **)(*(long *)((long)ctx + 0x10) + 0x10))(*(undefined8 *)((long)ctx + 0x20));
  }
  return ctx_local._4_4_;
}

Assistant:

static int
hasInternalSubsetSplit(void *ctx)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->hasInternalSubset != NULL))
	return(ctxt->user_sax->hasInternalSubset(ctxt->user_data));
    return(0);
}